

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O2

void __thiscall
FactorTimer::reportFactorClockList
          (FactorTimer *this,char *grepStamp,HighsTimerClock *factor_timer_clock,
          vector<int,_std::allocator<int>_> *factor_clock_list)

{
  HighsTimer *this_00;
  pointer piVar1;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  vector<int,_std::allocator<int>_> clockList;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  this_00 = factor_timer_clock->timer_pointer_;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = (ulong)((long)(factor_clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(factor_clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  iVar2 = (int)uVar3;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)iVar2);
  piVar1 = (factor_timer_clock->clock_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __buf = (void *)0x0;
  pvVar4 = (void *)(uVar3 & 0xffffffff);
  if (iVar2 < 1) {
    pvVar4 = __buf;
  }
  for (; pvVar4 != __buf; __buf = (void *)((long)__buf + 1)) {
    local_48._M_impl.super__Vector_impl_data._M_start[(long)__buf] =
         piVar1[(factor_clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)__buf]];
  }
  piVar1 = local_48._M_impl.super__Vector_impl_data._M_start;
  HighsTimer::read(this_00,*(factor_timer_clock->clock_).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,__buf,
                   (size_t)local_48._M_impl.super__Vector_impl_data._M_start);
  HighsTimer::read(this_00,(factor_timer_clock->clock_).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[5],__buf_00,(size_t)piVar1);
  HighsTimer::read(this_00,(factor_timer_clock->clock_).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[0x19],__buf_01,(size_t)piVar1);
  HighsTimer::reportOnTolerance
            (this_00,grepStamp,(vector<int,_std::allocator<int>_> *)&local_48,
             extraout_XMM0_Qa + 0.0 + extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01,1e-08);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void reportFactorClockList(const char* grepStamp,
                             HighsTimerClock& factor_timer_clock,
                             std::vector<HighsInt> factor_clock_list) {
    HighsTimer* timer_pointer = factor_timer_clock.timer_pointer_;
    std::vector<HighsInt>& clock = factor_timer_clock.clock_;
    HighsInt factor_clock_list_size = factor_clock_list.size();
    std::vector<HighsInt> clockList;
    clockList.resize(factor_clock_list_size);
    for (HighsInt en = 0; en < factor_clock_list_size; en++) {
      clockList[en] = clock[factor_clock_list[en]];
    }
    double ideal_sum_time = 0;
    ideal_sum_time += timer_pointer->read(clock[FactorInvert]);
    ideal_sum_time += timer_pointer->read(clock[FactorFtran]);
    ideal_sum_time += timer_pointer->read(clock[FactorBtran]);
    timer_pointer->reportOnTolerance(grepStamp, clockList, ideal_sum_time,
                                     1e-8);
  }